

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_benchmark.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_68b9::Benchmark::Test(Benchmark *this,string *filename)

{
  uint *puVar1;
  bool bVar2;
  uint64_t seed;
  pointer pcVar3;
  pointer pcVar4;
  pointer pSVar5;
  pointer pcVar6;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long *plVar10;
  char cVar11;
  uint32_t uVar12;
  Util *this_00;
  istream *piVar13;
  long lVar14;
  ostream *poVar15;
  size_t sVar16;
  char *pcVar17;
  int *piVar18;
  long lVar19;
  undefined1 *puVar20;
  size_t sVar21;
  undefined1 *puVar22;
  size_t sVar23;
  pointer pSVar24;
  int i;
  long lVar25;
  long lVar26;
  char *__format;
  ulong uVar27;
  ulong uVar28;
  Benchmark *puzzle;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  Benchmark *pBVar32;
  int iVar33;
  char *pcVar34;
  bool bVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM3 [64];
  double dVar39;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM5_Qb;
  size_t puzzle_guesses;
  long *local_4f8 [2];
  long local_4e8 [2];
  char puzzle_output [81];
  vector<int,_std::allocator<int>_> perm;
  long *local_458 [2];
  long local_448 [2];
  ifstream file;
  int iStack_434;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined8 uStack_3f4;
  undefined8 uStack_3ec;
  undefined8 uStack_3e4;
  undefined8 uStack_3dc;
  undefined8 uStack_3d4;
  int local_3cc [231];
  
  seed = (this->options_).random_seed;
  if (seed != 0) {
    Util::RandomSeed(&this->util,seed);
  }
  std::ifstream::ifstream((string *)&file);
  std::ifstream::open((string *)&file,(_Ios_Openmode)filename);
  if ((*(byte *)((long)&uStack_418 + *(long *)(_file + -0x18)) & 5) != 0) {
LAB_00105637:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error opening ",0xe);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                         filename->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar15);
    exit(1);
  }
  this->allow_zero_ = false;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->dataset_,this->puzzle_buf_size_ * (this->options_).test_dataset_size);
  pcVar3 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar4) {
    memset(pcVar3,0,(long)pcVar4 - (long)pcVar3);
  }
  puzzle_output._0_8_ = puzzle_output + 0x10;
  puzzle_output[8] = '\0';
  puzzle_output[9] = '\0';
  puzzle_output[10] = '\0';
  puzzle_output[0xb] = '\0';
  puzzle_output[0xc] = '\0';
  puzzle_output[0xd] = '\0';
  puzzle_output[0xe] = '\0';
  puzzle_output[0xf] = '\0';
  puzzle_output[0x10] = '\0';
  this_00 = &this->util;
  uVar31 = 0;
  uVar28 = 0;
  do {
    uVar29 = (uint)uVar28;
LAB_00104b0b:
    cVar11 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(string *)&file);
    piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&file,(string *)puzzle_output,cVar11);
    if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      if ((uVar29 == uVar31) &&
         (uVar27 = (ulong)(int)(uVar29 + uVar31), uVar27 < (this->options_).test_dataset_size)) {
        do {
          lVar14 = (long)(int)uVar28;
          pcVar3 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(pcVar3 + this->puzzle_buf_size_ * lVar14,pcVar3,
                 this->puzzle_buf_size_ * (long)(int)uVar31);
          uVar30 = (ulong)uVar31;
          if ((0 < (int)uVar31 & (this->options_).randomize) == 1) {
            do {
              Util::PermuteSudoku(this_00,(this->dataset_).
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          this->puzzle_buf_size_ * lVar14,
                                  (this->options_).pencilmark);
              lVar14 = lVar14 + 1;
              uVar30 = uVar30 - 1;
            } while (uVar30 != 0);
          }
          uVar27 = uVar27 + (long)(int)uVar31;
          uVar29 = (int)uVar28 + uVar31;
          uVar28 = (ulong)uVar29;
        } while (uVar27 < (this->options_).test_dataset_size);
      }
      uVar28 = (ulong)(int)uVar29;
      if (uVar28 < (this->options_).test_dataset_size) {
        do {
          uVar12 = Util::RandomUInt(this_00);
          pcVar3 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          strncpy(pcVar3 + this->puzzle_buf_size_ * uVar28,
                  pcVar3 + this->puzzle_buf_size_ * ((ulong)uVar12 % (ulong)uVar29),
                  this->puzzle_size_);
          if ((this->options_).randomize == true) {
            Util::PermuteSudoku(this_00,(this->dataset_).
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                        this->puzzle_buf_size_ * uVar28,(this->options_).pencilmark)
            ;
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (this->options_).test_dataset_size);
      }
      if ((char *)puzzle_output._0_8_ != puzzle_output + 0x10) {
        operator_delete((void *)puzzle_output._0_8_,
                        CONCAT71(puzzle_output._17_7_,puzzle_output[0x10]) + 1);
      }
      std::ifstream::~ifstream(&file);
      if ((this->options_).csv_output == false) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        poVar15 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"|",1);
        lVar14 = *(long *)poVar15;
        lVar19 = *(long *)(lVar14 + -0x18);
        *(uint *)(poVar15 + lVar19 + 0x18) = *(uint *)(poVar15 + lVar19 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar15 + *(long *)(lVar14 + -0x18) + 0x10) = 0x25;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,(filename->_M_dataplus)._M_p,filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "|  puzzles/sec|  usec/puzzle|   %no_guess|  guesses/puzzle|",0x3b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "|--------------------------------------|------------:|------------:|-----------:|---------------:|"
                   ,0x62);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      Util::Permutation(&perm,this_00,(this->options_).test_dataset_size);
      pSVar24 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>._M_impl
                .super__Vector_impl_data._M_start;
      pSVar5 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pSVar24 == pSVar5) {
          if (perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          return;
        }
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar38 = ZEXT1664(in_ZMM2._0_16_);
        lVar14 = std::chrono::_V2::steady_clock::now();
        auVar37 = auVar38._0_16_;
        lVar14 = SUB168(SEXT816(lVar14) * SEXT816(-0x20c49ba5e353f7cf),8);
        dVar36 = NAN;
        if (0 < (this->options_).min_seconds_warmup) {
          iVar33 = 0;
          while( true ) {
            auVar37 = auVar38._0_16_;
            pBVar32 = (Benchmark *)this->puzzle_buf_size_;
            uVar12 = Util::RandomUInt(this_00);
            pcVar34 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      ((ulong)uVar12 % (this->options_).test_dataset_size) * (long)pBVar32;
            puzzle_output[0] = '.';
            sVar16 = (*pSVar24->solve_)(pcVar34,1,pSVar24->configuration_,puzzle_output,
                                        (size_t *)local_4f8);
            if (this->allow_zero_ == false) break;
LAB_0010513d:
            iVar33 = iVar33 + 1;
            auVar38 = ZEXT1664(auVar37);
            lVar19 = std::chrono::_V2::steady_clock::now();
            auVar37 = auVar38._0_16_;
            lVar26 = lVar19 / 1000 + ((lVar14 >> 7) - (lVar14 >> 0x3f));
            lVar19 = (long)(this->options_).min_seconds_warmup;
            if (SBORROW8(lVar26,lVar19 * 1000000) == lVar26 + lVar19 * -1000000 < 0) {
              dVar36 = ((double)iVar33 * 1000000.0) / (double)lVar26;
              goto LAB_0010519a;
            }
          }
          puzzle = this;
          if (sVar16 != 0) {
            if (((this->options_).validate == true) && (pSVar24->returns_solution_ == true)) {
              uStack_3f8 = 0;
              uStack_3f4 = 0;
              uStack_3ec = 0;
              uStack_3e4 = 0;
              uStack_3dc = 0;
              uStack_3d4 = 0;
              _file = 0;
              uStack_430 = 0;
              uStack_428 = 0;
              uStack_420 = 0;
              uStack_418 = 0;
              uStack_410 = 0;
              uStack_40c = 0;
              uStack_408 = 0;
              uStack_404 = 0;
              uStack_400 = 0;
              uStack_3fc = 0;
              pcVar17 = puzzle_output;
              uVar28 = 0;
              do {
                uVar27 = 0;
                do {
                  uVar31 = 1 << ((byte)(pcVar17[uVar27] - 0x31) & 0x1f);
                  *(uint *)(&file + uVar28 * 4) = *(uint *)(&file + uVar28 * 4) ^ uVar31;
                  puVar1 = (uint *)((long)&uStack_418 + uVar27 * 4 + 4);
                  *puVar1 = *puVar1 ^ uVar31;
                  *(uint *)(&file + (long)((int)((uVar27 & 0xffffffff) / 3) +
                                          (int)((uVar28 & 0xffffffff) / 3) * 3 + 0x12) * 4) =
                       *(uint *)(&file + (long)((int)((uVar27 & 0xffffffff) / 3) +
                                               (int)((uVar28 & 0xffffffff) / 3) * 3 + 0x12) * 4) ^
                       uVar31;
                  uVar27 = uVar27 + 1;
                } while (uVar27 != 9);
                uVar28 = uVar28 + 1;
                pcVar17 = pcVar17 + 9;
              } while (uVar28 != 9);
              uVar28 = 7;
              piVar18 = (int *)&uStack_430;
              do {
                if (piVar18[-2] != 0x1ff) {
                  piVar18 = piVar18 + -2;
                  goto LAB_0010512c;
                }
                if (piVar18[-1] != 0x1ff) {
                  piVar18 = piVar18 + -1;
                  goto LAB_0010512c;
                }
                if (*piVar18 != 0x1ff) goto LAB_0010512c;
                if (piVar18[1] != 0x1ff) {
                  piVar18 = piVar18 + 1;
                  goto LAB_0010512c;
                }
                uVar28 = uVar28 - 1;
                piVar18 = piVar18 + 4;
              } while (1 < uVar28);
              piVar18 = (int *)((long)&uStack_3dc + 4);
              if (uStack_3dc._4_4_ == 0x1ff) {
                piVar18 = (int *)&uStack_3d4;
                if ((int)uStack_3d4 == 0x1ff) {
                  piVar18 = (int *)((long)&uStack_3d4 + 4);
                  if (uStack_3d4._4_4_ == 0x1ff) {
                    piVar18 = local_3cc;
                  }
                }
              }
LAB_0010512c:
              if (piVar18 != local_3cc) goto LAB_0010560e;
            }
            goto LAB_0010513d;
          }
LAB_0010560e:
          ExitError(this,pcVar34,"warmup");
          this = pBVar32;
LAB_00105625:
          ExitError(this,(char *)puzzle,"benchmark");
          goto LAB_00105637;
        }
LAB_0010519a:
        dVar36 = dVar36 * (double)(this->options_).min_seconds_test;
        auVar8._8_8_ = in_XMM5_Qb;
        auVar8._0_8_ = in_XMM5_Qa;
        auVar8 = vcvtusi2sd_avx512f(auVar8,(this->options_).test_dataset_size);
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar38 = ZEXT1664(auVar37);
        lVar14 = std::chrono::_V2::steady_clock::now();
        auVar37 = auVar38._0_16_;
        lVar14 = lVar14 / 1000;
        iVar33 = (this->options_).min_seconds_test;
        if (dVar36 + dVar36 <= auVar8._0_8_) {
          if (iVar33 < 1) goto LAB_001053ca;
          lVar19 = 0;
          pcVar34 = (char *)0x0;
          puVar22 = (undefined1 *)0x0;
          do {
            puzzle = (Benchmark *)
                     ((this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                     (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [(ulong)puVar22 % (this->options_).test_dataset_size] *
                     this->puzzle_buf_size_);
            sVar21 = (*pSVar24->solve_)((char *)puzzle,2 - (ulong)(this->options_).first_solution,
                                        pSVar24->configuration_,puzzle_output,&puzzle_guesses);
            sVar16 = puzzle_guesses;
            if ((sVar21 == 0) && (this->allow_zero_ == false)) goto LAB_00105625;
            lVar26 = std::chrono::_V2::steady_clock::now();
            auVar37 = auVar38._0_16_;
            lVar26 = lVar26 / 1000;
            puVar22 = puVar22 + 1;
            pcVar34 = pcVar34 + (sVar16 == 0);
            lVar19 = lVar19 + sVar16;
            lVar25 = (long)(this->options_).min_seconds_test;
          } while (SBORROW8(lVar26 - lVar14,lVar25 * 2000000) !=
                   (lVar26 - lVar14) + lVar25 * -2000000 < 0);
        }
        else if (iVar33 < 1) {
LAB_001053ca:
          puVar22 = (undefined1 *)0x0;
          pcVar34 = (char *)0x0;
          lVar19 = 0;
          lVar26 = lVar14;
        }
        else {
          lVar19 = 0;
          pcVar34 = (char *)0x0;
          puVar22 = (undefined1 *)0x0;
          do {
            puVar20 = (undefined1 *)(this->options_).test_dataset_size;
            if (puVar20 != (undefined1 *)0x0) {
              pBVar32 = (Benchmark *)0x0;
              do {
                puzzle = (Benchmark *)
                         ((this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + this->puzzle_buf_size_ * (long)pBVar32)
                ;
                sVar16 = (*pSVar24->solve_)((char *)puzzle,
                                            2 - (ulong)(this->options_).first_solution,
                                            pSVar24->configuration_,puzzle_output,&puzzle_guesses);
                if ((sVar16 == 0) && (this->allow_zero_ == false)) {
                  ExitError(this,(char *)puzzle,"benchmark");
                  goto LAB_0010560e;
                }
                lVar19 = lVar19 + puzzle_guesses;
                pcVar34 = pcVar34 + (puzzle_guesses == 0);
                pBVar32 = (Benchmark *)&(pBVar32->options_).rate_by_backtracks;
                puVar20 = (undefined1 *)(this->options_).test_dataset_size;
              } while (pBVar32 < puVar20);
            }
            puVar22 = puVar20 + (long)puVar22;
            lVar26 = std::chrono::_V2::steady_clock::now();
            auVar37 = auVar38._0_16_;
            lVar26 = lVar26 / 1000;
            lVar25 = (long)(this->options_).min_seconds_test;
          } while (SBORROW8(lVar26 - lVar14,lVar25 * 1000000) !=
                   (lVar26 - lVar14) + lVar25 * -1000000 < 0);
        }
        setlocale(1,"");
        bVar2 = (this->options_).csv_output;
        bVar35 = pSVar24->returns_guess_count_;
        pcVar6 = (filename->_M_dataplus)._M_p;
        local_4f8[0] = local_4e8;
        pcVar7 = (pSVar24->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar7,pcVar7 + (pSVar24->name_)._M_string_length);
        plVar10 = local_4f8[0];
        local_458[0] = local_448;
        pcVar7 = (pSVar24->desc_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_458,pcVar7,pcVar7 + (pSVar24->desc_)._M_string_length);
        bVar35 = (bVar35 & 1U) != 0;
        pcVar17 = "%s,%s,%s,%s,%s%.0s,%f,%f,N/A,N/A";
        if (bVar35) {
          pcVar17 = "%s,%s,%s,%s,%s%.0s,%f,%f,%f,%f";
        }
        __format = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |        N/A |            N/A |";
        if (bVar35) {
          __format = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |%10.1f%% |%\'15.2f |";
        }
        if (bVar2 != false) {
          __format = pcVar17;
        }
        auVar8 = vcvtusi2sd_avx512f(auVar37,lVar19);
        auVar9 = vcvtusi2sd_avx512f(auVar37,puVar22);
        dVar39 = auVar9._0_8_;
        auVar37 = vcvtusi2sd_avx512f(auVar37,(long)pcVar34 * 100);
        dVar36 = auVar37._0_8_ / dVar39;
        in_ZMM2 = ZEXT1664(CONCAT88(auVar37._8_8_,dVar36));
        auVar37._8_8_ = in_XMM5_Qb;
        auVar37._0_8_ = in_XMM5_Qa;
        auVar37 = vcvtusi2sd_avx512f(auVar37,(long)puVar22 * 1000000);
        snprintf((char *)&file,0x400,__format,auVar37._0_8_ / (double)(lVar26 - lVar14),
                 (double)(lVar26 - lVar14) / dVar39,dVar36,auVar8._0_8_ / dVar39,"Clang","19.1.5",
                 "-O1 -O3  -march=native",pcVar6,plVar10,local_458[0]);
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        if (local_4f8[0] != local_4e8) {
          operator_delete(local_4f8[0],local_4e8[0] + 1);
        }
        sVar23 = strlen((char *)&file);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&file,sVar23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        pSVar24 = pSVar24 + 1;
      } while( true );
    }
    if ((puzzle_output._8_8_ == 0) || (*(char *)puzzle_output._0_8_ == '#')) {
      lVar14 = std::__cxx11::string::find(puzzle_output,0x10c434,0);
      if (lVar14 != -1) {
        this->allow_zero_ = true;
      }
      goto LAB_00104b0b;
    }
    if (*(char *)(puzzle_output._0_8_ + -1 + puzzle_output._8_8_) == '\r') {
      puzzle_output._8_8_ = puzzle_output._8_8_ + -1;
      *(undefined1 *)(puzzle_output._0_8_ + puzzle_output._8_8_) = 0;
    }
    if ((ulong)puzzle_output._8_8_ < this->puzzle_size_) goto LAB_00104b0b;
    uVar31 = uVar31 + 1;
    if ((this->options_).test_dataset_size <= uVar28) {
      dVar36 = Util::RandomDouble(this_00);
      auVar37 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,(this->options_).test_dataset_size);
      in_ZMM2 = ZEXT1664(CONCAT88(in_ZMM3._8_8_,(double)(int)uVar31));
      if (dVar36 < auVar37._0_8_ / (double)(int)uVar31) {
        uVar12 = Util::RandomUInt(this_00);
        pcVar34 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((ulong)uVar12 % (this->options_).test_dataset_size) * this->puzzle_buf_size_;
        strncpy(pcVar34,(char *)puzzle_output._0_8_,this->puzzle_size_);
        if ((this->options_).randomize == true) {
          Util::PermuteSudoku(this_00,pcVar34,(this->options_).pencilmark);
        }
      }
      goto LAB_00104b0b;
    }
    pcVar34 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + uVar28 * this->puzzle_buf_size_;
    strncpy(pcVar34,(char *)puzzle_output._0_8_,this->puzzle_size_);
    if ((this->options_).randomize == true) {
      Util::PermuteSudoku(this_00,pcVar34,(this->options_).pencilmark);
    }
    uVar28 = (ulong)(uVar29 + 1);
  } while( true );
}

Assistant:

void Test(const string &filename) {
        if (options_.random_seed > 0) {
            util.RandomSeed(options_.random_seed);
        }
        Load(filename);
        OutputHeader(filename);

        // for the slow solvers we'll solve puzzles in this order to avoid any difficulty biases.
        auto perm = util.Permutation(options_.test_dataset_size);

        for (const Solver &solver : options_.solvers) {
            double puzzles_per_second = WarmupAndEstimateRate(solver);
            // we'll use the procedure for fast solvers if we expect to complete a full pass through
            // the data set in less than twice the min test time (or really less than up to 4x the min
            // test time since warmup is run with a limit of 1).
            bool fast = puzzles_per_second * options_.min_seconds_test * 2 > options_.test_dataset_size;

            char puzzle_output[81]{0};
            size_t puzzle_guesses;
            size_t total_guesses = 0;
            size_t total_no_guess = 0;
            size_t total_solved = 0;

            microseconds start = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
            microseconds end = start;

            if (fast) {
                while ((end - start).count() < options_.min_seconds_test * 1000000) {
                    for (int i = 0; i < options_.test_dataset_size; i++) {
                        const char *puzzle = &dataset_[puzzle_buf_size_ * i];
                        size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                        puzzle_output, &puzzle_guesses);
                        if (!allow_zero_ && !solutions) {
                            ExitError(puzzle, "benchmark");
                        }
                        total_guesses += puzzle_guesses;
                        total_no_guess += (puzzle_guesses == 0);
                    }
                    total_solved += options_.test_dataset_size;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            } else {
                while ((end - start).count() < options_.min_seconds_test * 2000000) {
                    const char *puzzle = &dataset_[puzzle_buf_size_ * perm[total_solved % options_.test_dataset_size]];
                    size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                    puzzle_output, &puzzle_guesses);
                    if (!allow_zero_ && !solutions) {
                        ExitError(puzzle, "benchmark");
                    }
                    total_guesses += puzzle_guesses;
                    total_no_guess += (puzzle_guesses == 0);
                    total_solved += 1;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            }

            auto total_usec = (end - start).count();
            OutputResult(solver, filename, total_solved, total_usec, total_guesses, total_no_guess);
        }
    }